

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rule_utils.cpp
# Opt level: O0

RuleBuilder * __thiscall Potassco::RuleBuilder::startMinimize(RuleBuilder *this,Weight_t prio)

{
  Rule *pRVar1;
  undefined4 in_ESI;
  RuleBuilder *in_RDI;
  Rule *r;
  undefined8 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  
  pRVar1 = unfreeze((RuleBuilder *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                    SUB81((ulong)in_stack_ffffffffffffffe8 >> 0x38,0));
  if ((((ulong)pRVar1->head & 0x3fffffff) == 0) && (((ulong)pRVar1->body & 0x3fffffff) == 0)) {
    Rule::Span::init(&pRVar1->head,(EVP_PKEY_CTX *)(ulong)(*(uint *)pRVar1 & 0x7fffffff));
    pRVar1 = anon_unknown_20::push<int>
                       ((MemoryRegion *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),pRVar1,
                        (int *)in_RDI);
    Rule::Span::init(&pRVar1->body,(EVP_PKEY_CTX *)(ulong)(*(uint *)pRVar1 & 0x7fffffff));
    return in_RDI;
  }
  fail(-1,"RuleBuilder &Potassco::RuleBuilder::startMinimize(Weight_t)",0x98,
       "!r->head.mbeg && !r->body.mbeg","Invalid call to startMinimize()",0);
}

Assistant:

RuleBuilder& RuleBuilder::startMinimize(Weight_t prio) {
	Rule* r = unfreeze(true);
	POTASSCO_ASSERT(!r->head.mbeg && !r->body.mbeg, "Invalid call to startMinimize()");
	r->head.init(r->top, Directive_t::Minimize);
	r = push(mem_, r, prio);
	r->body.init(r->top, Body_t::Sum);
	return *this;
}